

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

zmsg_t * czhelp_zmsg_createv(char *picture,__va_list_tag *argptr)

{
  char cVar1;
  uint uVar2;
  zmsg_t *self;
  zchunk_t *self_00;
  zuuid_t *self_01;
  zmsg_t *self_02;
  int *piVar3;
  byte *pbVar4;
  uint *puVar5;
  double *pdVar6;
  ushort *puVar7;
  undefined8 *puVar8;
  zframe_t *pzVar9;
  byte *data;
  size_t sVar10;
  ulong uVar11;
  char *format;
  string *data_00;
  binarydata dat;
  
  self_02 = zmsg_new();
  do {
    cVar1 = *picture;
    switch(cVar1) {
    case 'b':
      uVar2 = argptr->gp_offset;
      uVar11 = (ulong)uVar2;
      if (uVar11 < 0x29) {
        argptr->gp_offset = (uint)(uVar11 + 8);
        data_00 = *(string **)((long)argptr->reg_save_area + uVar11);
        if (0x20 < uVar2) goto LAB_001929bf;
        piVar3 = (int *)(uVar11 + 8 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 0x10;
      }
      else {
        puVar8 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar8 + 1;
        data_00 = (string *)*puVar8;
LAB_001929bf:
        piVar3 = (int *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = piVar3 + 2;
      }
      sVar10 = (size_t)*piVar3;
      goto LAB_00192b1e;
    case 'c':
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar8 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar8 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar8 + 1;
      }
      self_00 = (zchunk_t *)*puVar8;
      data = zchunk_data(self_00);
      sVar10 = zchunk_size(self_00);
      goto LAB_00192bb5;
    case 'd':
      uVar2 = argptr->fp_offset;
      if ((ulong)uVar2 < 0xa1) {
        pdVar6 = (double *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->fp_offset = uVar2 + 0x10;
      }
      else {
        pdVar6 = (double *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = pdVar6 + 1;
      }
      std::__cxx11::to_string(&dat.str,*pdVar6);
      zmsg_addstr(self_02,dat.str._M_dataplus._M_p);
      goto LAB_00192ab0;
    case 'e':
    case 'g':
    case 'j':
    case 'k':
    case 'l':
    case 'o':
    case 'q':
    case 'r':
    case 't':
    case 'v':
    case 'w':
    case 'x':
    case 'y':
      goto switchD_00192733_caseD_65;
    case 'f':
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar8 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar8 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar8 + 1;
      }
      pzVar9 = (zframe_t *)*puVar8;
      data = zframe_data(pzVar9);
      sVar10 = zframe_size(pzVar9);
LAB_00192bb5:
      zmsg_addmem(self_02,data,sVar10);
      break;
    case 'h':
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar8 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar8 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar8 + 1;
      }
      dat.str._M_dataplus._M_p = (pointer)zhashx_pack((zhashx_t *)*puVar8);
      zmsg_append(self_02,(zframe_t **)&dat.str);
      break;
    case 'i':
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar5 = (uint *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar5 = (uint *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar5 + 2;
      }
      uVar11 = (ulong)*puVar5;
      format = "%d";
      goto LAB_00192b84;
    case 'm':
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar8 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar8 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar8 + 1;
      }
      self = (zmsg_t *)*puVar8;
      pzVar9 = zmsg_first(self);
      while (pzVar9 != (zframe_t *)0x0) {
        dat.str._M_dataplus._M_p = (pointer)zframe_dup(pzVar9);
        zmsg_append(self_02,(zframe_t **)&dat.str);
        pzVar9 = zmsg_next(self);
      }
      break;
    case 'n':
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar8 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar8 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar8 + 1;
      }
      (**(code **)(*(long *)*puVar8 + 0x10))(&dat.str);
      CZHelp::zmsg_addNDT(self_02,(binarydata *)&dat.str);
LAB_00192ab0:
      std::__cxx11::string::~string((string *)&dat.str);
      break;
    case 'p':
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar8 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar8 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar8 + 1;
      }
      dat.str._M_dataplus._M_p = (pointer)*puVar8;
      sVar10 = 8;
      data_00 = &dat.str;
      goto LAB_00192b1e;
    case 's':
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar8 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar8 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar8 + 1;
      }
      zmsg_addstr(self_02,(char *)*puVar8);
      break;
    case 'u':
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar5 = (uint *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar5 = (uint *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar5 + 2;
      }
      uVar11 = (ulong)*puVar5;
      format = "%ud";
      goto LAB_00192b84;
    case 'z':
      sVar10 = 0;
      data_00 = (string *)0x0;
LAB_00192b1e:
      zmsg_addmem(self_02,data_00,sVar10);
      break;
    default:
      switch(cVar1) {
      case '1':
        uVar2 = argptr->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          pbVar4 = (byte *)((ulong)uVar2 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar2 + 8;
        }
        else {
          pbVar4 = (byte *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = pbVar4 + 8;
        }
        uVar11 = (ulong)*pbVar4;
        break;
      case '2':
        uVar2 = argptr->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar7 = (ushort *)((ulong)uVar2 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar2 + 8;
        }
        else {
          puVar7 = (ushort *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = puVar7 + 4;
        }
        uVar11 = (ulong)*puVar7;
        break;
      case '3':
      case '5':
      case '6':
      case '7':
        goto switchD_00192733_caseD_65;
      case '4':
        uVar2 = argptr->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar5 = (uint *)((ulong)uVar2 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar2 + 8;
        }
        else {
          puVar5 = (uint *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = puVar5 + 2;
        }
        uVar11 = (ulong)*puVar5;
        break;
      case '8':
        uVar2 = argptr->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar8 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar2 + 8;
        }
        else {
          puVar8 = (undefined8 *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = puVar8 + 1;
        }
        zmsg_addstrf(self_02,"%lu",*puVar8);
        goto LAB_00192bc4;
      default:
        if (cVar1 == 'U') {
          uVar2 = argptr->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            puVar8 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
            argptr->gp_offset = uVar2 + 8;
          }
          else {
            puVar8 = (undefined8 *)argptr->overflow_arg_area;
            argptr->overflow_arg_area = puVar8 + 1;
          }
          self_01 = (zuuid_t *)*puVar8;
          data = zuuid_data(self_01);
          sVar10 = zuuid_size(self_01);
          goto LAB_00192bb5;
        }
        if (cVar1 == '\0') {
          return self_02;
        }
        goto switchD_00192733_caseD_65;
      }
      format = "%u";
LAB_00192b84:
      zmsg_addstrf(self_02,format,uVar11);
    }
LAB_00192bc4:
    picture = picture + 1;
  } while( true );
switchD_00192733_caseD_65:
  zsys_error("zsock: invalid picture element \'%c\'");
  goto LAB_00192bc4;
}

Assistant:

zmsg_t* czhelp_zmsg_createv(const char *picture, va_list argptr){
    zmsg_t *msg = zmsg_new ();
    while (*picture) {
//        std::cerr << picture << "\n";
        if (*picture == 'i')
            zmsg_addstrf (msg, "%d", va_arg (argptr, int));
        else if (*picture == '1')
            zmsg_addstrf (msg, "%" PRIu8, (uint8_t) va_arg (argptr, int));
        else if (*picture == '2')
            zmsg_addstrf (msg, "%" PRIu16, (uint16_t) va_arg (argptr, int));
        else if (*picture == '4')
            zmsg_addstrf (msg, "%" PRIu32, va_arg (argptr, uint32_t));
        else if (*picture == '8')
            zmsg_addstrf (msg, "%" PRIu64, va_arg (argptr, uint64_t));
        else if (*picture == 'u')    //  Deprecated, use 4 or 8 instead
            zmsg_addstrf (msg, "%ud", va_arg (argptr, uint));
        else if (*picture == 'd')
            zmsg_addstr (msg, std::to_string(va_arg (argptr, double)).c_str());
        else if (*picture == 's') {
            char *str = va_arg(argptr, char *);
            zmsg_addstr (msg, str);
        }
        else if (*picture == 'b') {
            //  Note function arguments may be expanded in reverse order,
            //  so we cannot use va_arg macro twice in a single call
            byte *data = va_arg (argptr, byte *);
            zmsg_addmem (msg, data, va_arg (argptr, int));
        }
        else if (*picture == 'c') {
            zchunk_t *chunk = va_arg (argptr, zchunk_t *);
            assert (zchunk_is (chunk));
            zmsg_addmem (msg, zchunk_data (chunk), zchunk_size (chunk));
        }
        else if (*picture == 'f') {
            zframe_t *frame = va_arg (argptr, zframe_t *);
            assert (zframe_is (frame));
            zmsg_addmem (msg, zframe_data (frame), zframe_size (frame));
        }
        else if (*picture == 'U') {
            zuuid_t *uuid = va_arg (argptr, zuuid_t *);
            zmsg_addmem (msg, zuuid_data (uuid), zuuid_size (uuid));
        }
        else if (*picture == 'p') {
            void *pointer = va_arg (argptr, void *);
            zmsg_addmem (msg, &pointer, sizeof (void *));
        }
        else if (*picture == 'h') {
            zhashx_t *hash = va_arg (argptr, zhashx_t *);
            zframe_t *frame = zhashx_pack (hash);
            zmsg_append (msg, &frame);
        }
        else if (*picture == 'm') {
            zframe_t *frame;
            zmsg_t *zmsg = va_arg (argptr, zmsg_t *);
            for (frame = zmsg_first (zmsg); frame;
                    frame = zmsg_next (zmsg) ) {
                zframe_t *frame_dup = zframe_dup (frame);
                zmsg_append (msg, &frame_dup);
            }
        }
        else if (*picture == 'n') {
            NetworkDataType *val = va_arg(argptr, NetworkDataType *);
            binarydata dat = val->encode();
            CZHelp::zmsg_addNDT(msg, dat);
        }
        else if (*picture == 'z')
            zmsg_addmem (msg, NULL, 0);
        else {
            zsys_error ("zsock: invalid picture element '%c'", *picture);
            assert (false);
        }
        picture++;
    }
    return msg;
}